

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::convert_double_to_string_abi_cxx11_
          (CompilerGLSL *this,SPIRConstant *c,uint32_t col,uint32_t row)

{
  bool bVar1;
  uint uVar2;
  CompilerError *pCVar3;
  undefined4 in_register_00000014;
  uint32_t in_R8D;
  char *pcVar4;
  double __value;
  double dVar5;
  undefined1 local_408 [40];
  string local_3e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0 [32];
  spirv_cross local_3a0 [32];
  char *local_380;
  char *comment;
  char print_buffer [64];
  string local_330 [32];
  uint64_t local_310;
  uint64_t u64_value;
  SPIRType in_type;
  SPIRType out_type;
  double double_value;
  uint32_t row_local;
  uint32_t col_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  ::std::__cxx11::string::string((string *)this);
  __value = SPIRConstant::scalar_f64((SPIRConstant *)CONCAT44(in_register_00000014,col),row,in_R8D);
  uVar2 = ::std::isnan(__value);
  if (((uVar2 & 1) == 0) && (uVar2 = ::std::isinf(__value), (uVar2 & 1) == 0)) {
    format_double_abi_cxx11_((CompilerGLSL *)local_408,__value);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_408);
    ::std::__cxx11::string::~string((string *)local_408);
    if ((c[0x17].super_IVariant.self.id & 0x100) != 0) {
      ::std::__cxx11::string::operator+=((string *)this,"lf");
    }
  }
  else {
    bVar1 = is_legacy((CompilerGLSL *)c);
    if (bVar1) {
      if (((ulong)c[0x15].m.c[1].r[1] & 1) != 0) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar3,"FP64 not supported in ES profile.");
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (*(uint *)((long)c[0x15].m.c[1].r + 4) < 400) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_3e0,"GL_ARB_gpu_shader_fp64",(allocator *)(local_408 + 0x27));
        require_extension_internal((CompilerGLSL *)c,(string *)local_3e0);
        ::std::__cxx11::string::~string(local_3e0);
        ::std::allocator<char>::~allocator((allocator<char> *)(local_408 + 0x27));
      }
      dVar5 = ::std::numeric_limits<double>::infinity();
      if ((__value != dVar5) || (NAN(__value) || NAN(dVar5))) {
        dVar5 = ::std::numeric_limits<double>::infinity();
        if ((__value != -dVar5) || (NAN(__value) || NAN(-dVar5))) {
          uVar2 = ::std::isnan(__value);
          if ((uVar2 & 1) == 0) {
            pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar3,"Cannot represent non-finite floating point constant.");
            __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if ((c[0x17].super_IVariant.self.id & 0x100) == 0) {
            ::std::__cxx11::string::operator=((string *)this,"(0.0 / 0.0)");
          }
          else {
            ::std::__cxx11::string::operator=((string *)this,"(0.0lf / 0.0lf)");
          }
        }
        else if ((c[0x17].super_IVariant.self.id & 0x100) == 0) {
          ::std::__cxx11::string::operator=((string *)this,"(-1.0 / 0.0)");
        }
        else {
          ::std::__cxx11::string::operator=((string *)this,"(-1.0lf / 0.0lf)");
        }
      }
      else if ((c[0x17].super_IVariant.self.id & 0x100) == 0) {
        ::std::__cxx11::string::operator=((string *)this,"(1.0 / 0.0)");
      }
      else {
        ::std::__cxx11::string::operator=((string *)this,"(1.0lf / 0.0lf)");
      }
    }
    else {
      SPIRType::SPIRType((SPIRType *)&in_type.member_name_cache._M_h._M_single_bucket,OpTypeFloat);
      SPIRType::SPIRType((SPIRType *)&u64_value,OpTypeInt);
      in_type.super_IVariant.self.id = 10;
      in_type.basetype = Void;
      in_type.super_IVariant._12_4_ = 0x40;
      local_310 = SPIRConstant::scalar_u64
                            ((SPIRConstant *)CONCAT44(in_register_00000014,col),row,in_R8D);
      if ((((ulong)c[0x15].m.c[1].r[1] & 1) != 0) && (*(uint *)((long)c[0x15].m.c[1].r + 4) < 0x136)
         ) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar3,"64-bit integers not supported in ES profile before version 310.");
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_330,"GL_ARB_gpu_shader_int64",(allocator *)(print_buffer + 0x3f));
      require_extension_internal((CompilerGLSL *)c,(string *)local_330);
      ::std::__cxx11::string::~string(local_330);
      ::std::allocator<char>::~allocator((allocator<char> *)(print_buffer + 0x3f));
      pcVar4 = "ul";
      if ((c[0x17].super_IVariant.self.id & 0x1000000) != 0) {
        pcVar4 = "ull";
      }
      snprintf((char *)&comment,0x40,"0x%llx%s",local_310,pcVar4);
      local_380 = "inf";
      dVar5 = ::std::numeric_limits<double>::infinity();
      if ((__value != -dVar5) || (NAN(__value) || NAN(-dVar5))) {
        uVar2 = ::std::isnan(__value);
        if ((uVar2 & 1) != 0) {
          local_380 = "nan";
        }
      }
      else {
        local_380 = "-inf";
      }
      (*(c->super_IVariant)._vptr_IVariant[0x3c])
                (local_3c0,c,&in_type.member_name_cache._M_h._M_single_bucket,&u64_value);
      join<std::__cxx11::string,char_const(&)[2],char(&)[64],char_const(&)[5],char_const*&,char_const(&)[5]>
                (local_3a0,local_3c0,(char (*) [2])0x422b6e,(char (*) [64])&comment,
                 (char (*) [5])" /* ",&local_380,(char (*) [5])" */)");
      ::std::__cxx11::string::operator=((string *)this,(string *)local_3a0);
      ::std::__cxx11::string::~string((string *)local_3a0);
      ::std::__cxx11::string::~string((string *)local_3c0);
      SPIRType::~SPIRType((SPIRType *)&u64_value);
      SPIRType::~SPIRType((SPIRType *)&in_type.member_name_cache._M_h._M_single_bucket);
    }
  }
  return this;
}

Assistant:

std::string CompilerGLSL::convert_double_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	double double_value = c.scalar_f64(col, row);

	if (std::isnan(double_value) || std::isinf(double_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type { OpTypeFloat };
			SPIRType in_type { OpTypeInt };
			out_type.basetype = SPIRType::Double;
			in_type.basetype = SPIRType::UInt64;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 64;
			in_type.width = 64;

			uint64_t u64_value = c.scalar_u64(col, row);

			if (options.es && options.version < 310) // GL_NV_gpu_shader5 fallback requires 310.
				SPIRV_CROSS_THROW("64-bit integers not supported in ES profile before version 310.");
			require_extension_internal("GL_ARB_gpu_shader_int64");

			char print_buffer[64];
#ifdef _WIN32
			sprintf(print_buffer, "0x%llx%s", static_cast<unsigned long long>(u64_value),
			        backend.long_long_literal_suffix ? "ull" : "ul");
#else
			snprintf(print_buffer, sizeof(print_buffer), "0x%llx%s", static_cast<unsigned long long>(u64_value),
			         backend.long_long_literal_suffix ? "ull" : "ul");
#endif

			const char *comment = "inf";
			if (double_value == -numeric_limits<double>::infinity())
				comment = "-inf";
			else if (std::isnan(double_value))
				comment = "nan";
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, " /* ", comment, " */)");
		}
		else
		{
			if (options.es)
				SPIRV_CROSS_THROW("FP64 not supported in ES profile.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader_fp64");

			if (double_value == numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(1.0lf / 0.0lf)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (double_value == -numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(-1.0lf / 0.0lf)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(double_value))
			{
				if (backend.double_literal_suffix)
					res = "(0.0lf / 0.0lf)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = format_double(double_value);
		if (backend.double_literal_suffix)
			res += "lf";
	}

	return res;
}